

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

CMutableTransaction * __thiscall
wallet::wallet_tests::TestSimpleSpend
          (CMutableTransaction *__return_storage_ptr__,wallet_tests *this,CTransaction *from,
          uint32_t index,CKey *key,CScript *pubkey)

{
  CAmount *pCVar1;
  CScript scriptSigIn;
  mapped_type *pmVar2;
  undefined4 in_register_0000000c;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  input_errors;
  FillableSigningProvider keystore;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  check_type cVar3;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  lazy_ostream local_1d0;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  assertion_result local_1b0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  local_178;
  undefined1 local_148 [16];
  uchar local_138 [8];
  uchar local_130 [8];
  uchar *local_128;
  undefined1 local_120 [24];
  undefined1 local_108 [24];
  pointer local_f0;
  pointer local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  void *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  check_type cStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  size_t local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(__return_storage_ptr__);
  local_148._0_8_ = **(long **)(this + 0x18) + -10000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript_const&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&__return_storage_ptr__->vout,
             (long *)local_148,(CScript *)CONCAT44(in_register_0000000c,index));
  local_98 = *(undefined8 *)(this + 0x39);
  _cVar3 = *(check_type *)(this + 0x41);
  local_88 = *(undefined8 *)(this + 0x49);
  uStack_80 = *(undefined8 *)(this + 0x51);
  local_b8 = (void *)0x0;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  scriptSigIn.super_CScriptBase._union._8_8_ = in_stack_fffffffffffffe10;
  scriptSigIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffffe08;
  scriptSigIn.super_CScriptBase._union._16_8_ = in_stack_fffffffffffffe18;
  scriptSigIn.super_CScriptBase._24_8_ = in_stack_fffffffffffffe20;
  _cStack_90 = _cVar3;
  CTxIn::CTxIn((CTxIn *)local_148,(uint256)*(uint256 *)(this + 0x39),0,scriptSigIn,
               (uint32_t)&local_b8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<CTxIn>
            (&__return_storage_ptr__->vin,(CTxIn *)local_148);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)(local_108 + 0x10));
  if (0x1c < (uint)local_108._4_4_) {
    free((void *)local_120._0_8_);
    local_120._0_8_ = (char *)0x0;
  }
  if (0x1c < uStack_a0._4_4_) {
    free(local_b8);
    local_b8 = (void *)0x0;
  }
  local_128 = local_138;
  local_148._0_8_ = &PTR__FillableSigningProvider_013bce20;
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_130[0] = '\0';
  local_130[1] = '\0';
  local_130[2] = '\0';
  local_130[3] = '\0';
  local_130[4] = '\0';
  local_130[5] = '\0';
  local_130[6] = '\0';
  local_130[7] = '\0';
  local_120._8_8_ = 0;
  local_108._16_8_ = local_108;
  local_108._0_4_ = 0;
  local_108._8_8_ = (pointer)0x0;
  local_d8 = 0;
  local_e8 = (pointer)0x0;
  uStack_e0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  uStack_d0 = 1;
  local_120._0_8_ = local_128;
  local_f0 = (pointer)local_108._16_8_;
  CKey::GetPubKey((CPubKey *)local_78,(CKey *)from);
  (**(_func_int **)(local_148._0_8_ + 0x50))(local_148,from,local_78);
  local_60 = (_Base_ptr)(local_78 + 8);
  local_78._8_4_ = _S_red;
  local_68 = (_Base_ptr)0x0;
  local_50 = 0;
  pCVar1 = *(CAmount **)(this + 0x18);
  local_58 = local_60;
  pmVar2 = std::
           map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
           ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                         *)local_78,
                        &((__return_storage_ptr__->vin).
                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start)->prevout);
  (pmVar2->out).nValue = *pCVar1;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pmVar2->out).scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(pCVar1 + 1));
  local_178._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178._M_impl.super__Rb_tree_header._M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3b;
  file.m_begin = (iterator)&local_188;
  msg.m_end = (iterator)pubkey;
  msg.m_begin = &key->fCompressed;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
  local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       SignTransaction(__return_storage_ptr__,(SigningProvider *)local_148,
                       (map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                        *)local_78,1,
                       (map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                        *)&local_178);
  local_1b0.m_message.px = (element_type *)0x0;
  local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b8 = &stack0xfffffffffffffe20;
  local_1d0.m_empty = false;
  local_1d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b0,&local_1d0,1,0,WARN,_cVar3,(size_t)&stack0xfffffffffffffe10,0x3b);
  boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
  std::
  _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  ::~_Rb_tree(&local_178);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               *)local_78);
  local_148._0_8_ = &PTR__FillableSigningProvider_013bce20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
               *)(local_120 + 0x10));
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
               *)(local_148 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CMutableTransaction TestSimpleSpend(const CTransaction& from, uint32_t index, const CKey& key, const CScript& pubkey)
{
    CMutableTransaction mtx;
    mtx.vout.emplace_back(from.vout[index].nValue - DEFAULT_TRANSACTION_MAXFEE, pubkey);
    mtx.vin.push_back({CTxIn{from.GetHash(), index}});
    FillableSigningProvider keystore;
    keystore.AddKey(key);
    std::map<COutPoint, Coin> coins;
    coins[mtx.vin[0].prevout].out = from.vout[index];
    std::map<int, bilingual_str> input_errors;
    BOOST_CHECK(SignTransaction(mtx, &keystore, coins, SIGHASH_ALL, input_errors));
    return mtx;
}